

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_1_bare_args(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_ARGS,G->val[-2]);
  G->ss = pPVar1;
  G->val[-2] = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_bare_args(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define a G->val[-2]
  yyprintf((stderr, "do yy_1_bare_args"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_ARGS, a);\n\
        a=yy;\n\
    }\n"));
  
        yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_ARGS, a);
        a=yy;
    ;
#undef b
#undef a
}